

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roboclaw.cpp
# Opt level: O0

bool __thiscall
RoboClaw::SpeedAccelDeccelPositionM1M2
          (RoboClaw *this,uint32_t accel1,uint32_t speed1,uint32_t deccel1,uint32_t position1,
          uint32_t accel2,uint32_t speed2,uint32_t deccel2,uint32_t position2,uint8_t flag)

{
  bool bVar1;
  uint in_ECX;
  uint in_EDX;
  uint in_ESI;
  RoboClaw *in_RDI;
  uint in_R8D;
  uint in_R9D;
  uint in_stack_00000008;
  uint in_stack_00000010;
  uint in_stack_00000018;
  byte in_stack_00000020;
  
  bVar1 = write_n(in_RDI,'#',(ulong)in_RDI->m_address,0x43,(ulong)(in_ESI >> 0x18),
                  (ulong)(in_ESI >> 0x10 & 0xff),in_ESI >> 8 & 0xff,in_ESI & 0xff,in_EDX >> 0x18,
                  in_EDX >> 0x10 & 0xff,in_EDX >> 8 & 0xff,in_EDX & 0xff,in_ECX >> 0x18,
                  in_ECX >> 0x10 & 0xff,in_ECX >> 8 & 0xff,in_ECX & 0xff,in_R8D >> 0x18,
                  in_R8D >> 0x10 & 0xff,in_R8D >> 8 & 0xff,in_R8D & 0xff,in_R9D >> 0x18,
                  in_R9D >> 0x10 & 0xff,in_R9D >> 8 & 0xff,in_R9D & 0xff,in_stack_00000008 >> 0x18,
                  in_stack_00000008 >> 0x10 & 0xff,in_stack_00000008 >> 8 & 0xff,
                  in_stack_00000008 & 0xff,in_stack_00000010 >> 0x18,
                  in_stack_00000010 >> 0x10 & 0xff,in_stack_00000010 >> 8 & 0xff,
                  in_stack_00000010 & 0xff,in_stack_00000018 >> 0x18,
                  in_stack_00000018 >> 0x10 & 0xff,in_stack_00000018 >> 8 & 0xff,
                  in_stack_00000018 & 0xff,(uint)in_stack_00000020);
  return bVar1;
}

Assistant:

bool RoboClaw::SpeedAccelDeccelPositionM1M2( uint32_t accel1,uint32_t speed1,uint32_t deccel1,uint32_t position1,uint32_t accel2,uint32_t speed2,uint32_t deccel2,uint32_t position2,uint8_t flag)
{
    return write_n(35, m_address, MIXEDSPEEDACCELDECCELPOS,SetDWORDval(accel1),SetDWORDval(speed1),SetDWORDval(deccel1),SetDWORDval(position1),SetDWORDval(accel2),SetDWORDval(speed2),SetDWORDval(deccel2),SetDWORDval(position2),flag);
}